

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

bool compactor_is_valid_mode(char *filename,fdb_config *config)

{
  int iVar1;
  filemgr_ops *pfVar2;
  char path [1024];
  char acStack_418 [1024];
  
  pfVar2 = get_filemgr_ops();
  if (config->compaction_mode == '\0') {
    sprintf(acStack_418,"%s.meta",filename);
    filename = acStack_418;
  }
  else if (config->compaction_mode != '\x01') {
    return false;
  }
  iVar1 = (*pfVar2->open)(filename,0,0x1a4);
  if (iVar1 != -3) {
    (*pfVar2->close)(iVar1);
    return false;
  }
  return true;
}

Assistant:

bool compactor_is_valid_mode(const char *filename, fdb_config *config)
{
    int fd;
    char path[MAX_FNAMELEN];
    struct filemgr_ops *ops;

    ops = get_filemgr_ops();

    if (config->compaction_mode == FDB_COMPACTION_AUTO) {
        // auto compaction mode: invalid when
        // the file '[filename]' exists
        fd = ops->open(filename, O_RDONLY, 0644);
        if (fd != FDB_RESULT_NO_SUCH_FILE) {
            ops->close(fd);
            return false;
        }

    } else if (config->compaction_mode == FDB_COMPACTION_MANUAL) {
        // manual compaction mode: invalid when
        // the file '[filename].meta' exists
        sprintf(path, "%s.meta", filename);
        fd = ops->open(path, O_RDONLY, 0644);
        if (fd != FDB_RESULT_NO_SUCH_FILE) {
            ops->close(fd);
            return false;
        }

    } else {
        // unknown mode
        return false;
    }

    return true;
}